

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_reverse.c
# Opt level: O2

void linkedlist_reverse(s_linkedlist *linked_list)

{
  void *pvVar1;
  s_linkedlist_node *psVar2;
  
  psVar2 = (s_linkedlist_node *)&linked_list->tail;
  while( true ) {
    psVar2 = psVar2->previous;
    linked_list = (s_linkedlist *)((s_linkedlist_node *)linked_list)->next;
    if ((s_linkedlist_node *)linked_list == psVar2) break;
    pvVar1 = ((s_linkedlist_node *)linked_list)->element;
    ((s_linkedlist_node *)linked_list)->element = psVar2->element;
    psVar2->element = pvVar1;
  }
  return;
}

Assistant:

void linkedlist_reverse(s_linkedlist *linked_list) {
    s_linkedlist_node *front = linked_list->head;
    s_linkedlist_node *back  = linked_list->tail;

    while (front != back) {
        linkedlistnode_swap(front, back);

        front = front->next;
        back  = back->previous;
    }
}